

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O3

bool __thiscall
Assimp::Ogre::OgreImporter::ReadTechnique
          (OgreImporter *this,string *techniqueName,stringstream *ss,aiMaterial *material)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  char cVar2;
  int iVar3;
  Logger *pLVar4;
  bool bVar5;
  undefined1 newlines;
  _Alloc_hider _Var6;
  string passName;
  string linePart;
  string partPass;
  string local_218;
  undefined1 *local_1f8;
  size_t local_1f0;
  undefined1 local_1e8 [16];
  OgreImporter *local_1d8;
  aiMaterial *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  undefined8 local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [376];
  
  local_1f8 = local_1e8;
  local_1f0 = 0;
  local_1e8[0] = 0;
  local_1d8 = this;
  local_1d0 = material;
  std::operator>>((istream *)ss,(string *)&local_1f8);
  if ((local_1f0 == DAT_008ce308) &&
     ((local_1f0 == 0 || (iVar3 = bcmp(local_1f8,partBlockStart_abi_cxx11_,local_1f0), iVar3 == 0)))
     ) {
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[13]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [13])" technique \'");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(techniqueName->_M_dataplus)._M_p,
               techniqueName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar4,local_218._M_dataplus._M_p);
    paVar1 = &local_218.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar1) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"pass","");
LAB_00478ab6:
    while ((local_1f0 != DAT_008ce328 ||
           ((local_1f0 != 0 &&
            (iVar3 = bcmp(local_1f8,partBlockEnd_abi_cxx11_,local_1f0), iVar3 != 0))))) {
      std::operator>>((istream *)ss,(string *)&local_1f8);
      __n = local_1f0;
      if ((local_1f0 == DAT_008ce2e8) &&
         ((local_1f0 == 0 || (iVar3 = bcmp(local_1f8,partComment_abi_cxx11_,local_1f0), iVar3 == 0))
         )) goto LAB_00478ba9;
      if ((__n == local_1a8._8_8_) &&
         ((__n == 0 || (iVar3 = bcmp(local_1f8,(void *)local_1a8._0_8_,__n), iVar3 == 0)))) {
        local_218._M_string_length = 0;
        local_218.field_2._M_local_buf[0] = '\0';
        local_218._M_dataplus._M_p = (pointer)paVar1;
        cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)ss + -0x18) + (char)ss);
        newlines = (char)&local_218;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)ss,(string *)&local_218,cVar2);
        Trim(&local_218,(bool)newlines);
        ReadPass(local_1d8,&local_218,ss,local_1d0);
        _Var6._M_p = local_218._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar1) goto LAB_00478bee;
      }
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    bVar5 = true;
  }
  else {
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[60]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [60])"Invalid material: Technique block start missing near index ");
    std::istream::tellg();
    std::ostream::_M_insert<long>((long)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar4,local_218._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    bVar5 = false;
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  return bVar5;
LAB_00478ba9:
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_1c8 = &local_1b8;
  cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)ss + -0x18) + (char)ss);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)ss,(string *)&local_1c8,cVar2);
  _Var6._M_p = (pointer)local_1c8;
  if (local_1c8 != &local_1b8) {
LAB_00478bee:
    operator_delete(_Var6._M_p);
  }
  goto LAB_00478ab6;
}

Assistant:

bool OgreImporter::ReadTechnique(const std::string &techniqueName, stringstream &ss, aiMaterial *material)
{
    string linePart;
    ss >> linePart;

    if (linePart != partBlockStart)
    {
        ASSIMP_LOG_ERROR_F( "Invalid material: Technique block start missing near index ", ss.tellg());
        return false;
    }

    ASSIMP_LOG_DEBUG_F(" technique '", techniqueName, "'");

    const string partPass  = "pass";

    while(linePart != partBlockEnd)
    {
        ss >> linePart;

        // Skip commented lines
        if (linePart == partComment)
        {
            SkipLine(ss);
            continue;
        }

        /// @todo Techniques have other attributes than just passes.
        if (linePart == partPass)
        {
            string passName = SkipLine(ss);
            ReadPass(Trim(passName), ss, material);
        }
    }
    return true;
}